

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O0

LevenshteinDFA *
la::LevenshteinDFA::SubsetConstruct(LevenshteinDFA *__return_storage_ptr__,LevenshteinNFA *nfa)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference __x;
  reference piVar7;
  reference piVar8;
  pair<int,_char> pVar9;
  mapped_type *__args_1;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_bool>
  pVar13;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>,_bool> pVar14;
  __enable_if_t<is_constructible<value_type,_pair<pair<int,_char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var15;
  bool local_2d9;
  pair<std::pair<int,_char>,_int> local_264;
  int local_258;
  int local_254;
  int i_2;
  int i_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> map_tmp;
  pair<std::pair<int,_char>,_int> local_210;
  int local_204;
  _Node_iterator_base<std::pair<const_int,_int>,_false> _Stack_200;
  int i;
  undefined1 local_1f8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_1f0;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_1e8;
  iterator it_1;
  pair<int,_char> local_1d0;
  pair<int,_char> transition;
  int local_1b4;
  _Self local_1b0;
  _List_node_base *local_1a8;
  _List_iterator<std::__cxx11::list<int,_std::allocator<int>_>_> local_1a0;
  _Self local_198;
  _Self local_190;
  _List_node_base *local_188;
  _List_iterator<std::__cxx11::list<int,_std::allocator<int>_>_> local_180;
  _Self local_178;
  undefined4 local_16c;
  list<int,_std::allocator<int>_> local_168;
  undefined1 local_150 [8];
  list<int,_std::allocator<int>_> next;
  char *c;
  const_iterator __end2;
  const_iterator __begin2;
  forward_list<char,_std::allocator<char>_> *__range2;
  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
  vec_tmp;
  _Self local_f8;
  const_iterator it2;
  _Self local_e8;
  iterator it;
  list<int,_std::allocator<int>_> aState;
  undefined1 local_c0 [3];
  bool tag;
  int dfaInitial;
  list<int,_std::allocator<int>_> first;
  undefined1 local_98 [8];
  list<int,_std::allocator<int>_> nfaInitial;
  map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  dfaStateNum;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  unmarkedStates;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  markedStates;
  int num;
  LevenshteinNFA *nfa_local;
  LevenshteinDFA *dfa;
  
  LevenshteinDFA(__return_storage_ptr__);
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          *)&unmarkedStates.
             super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  ::map((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
         *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)local_98);
  std::__cxx11::list<int,std::allocator<int>>::emplace_back<int_const&>
            ((list<int,std::allocator<int>> *)local_98,&nfa->_initialState);
  EpsilonClosure((list<int,_std::allocator<int>_> *)local_c0,nfa,
                 (list<int,_std::allocator<int>_> *)local_98);
  std::__cxx11::
  list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
  ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
            ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
              *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (list<int,_std::allocator<int>_> *)local_c0);
  markedStates.
  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl._M_node._M_size._0_4_ = 1;
  pmVar5 = std::
           map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                         *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                            _M_size,(key_type *)local_c0);
  *pmVar5 = 0;
  do {
    sVar6 = std::__cxx11::
            list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ::size((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar6 == 0) {
      std::__cxx11::list<int,_std::allocator<int>_>::sort(&__return_storage_ptr__->_finalStates);
      std::__cxx11::list<int,_std::allocator<int>_>::unique(&__return_storage_ptr__->_finalStates);
      std::__cxx11::list<char,_std::allocator<char>_>::sort(&__return_storage_ptr__->_uniqueChars);
      std::__cxx11::list<char,_std::allocator<char>_>::unique(&__return_storage_ptr__->_uniqueChars)
      ;
      local_16c = 1;
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)local_c0);
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)local_98);
      std::
      map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
      ::~map((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
              *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      std::__cxx11::
      list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
      ::~list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
               *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::
      list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
      ::~list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
               *)&unmarkedStates.
                  super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                  ._M_impl._M_node._M_size);
      return __return_storage_ptr__;
    }
    bVar3 = false;
    __x = std::__cxx11::
          list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          ::front((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                   *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)&it,__x);
    std::__cxx11::
    list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
    ::pop_front((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                 *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::
    list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
    ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
              ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                *)&unmarkedStates.
                   super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                   ._M_impl._M_node._M_size,(list<int,_std::allocator<int>_> *)&it);
    local_e8._M_node =
         (_List_node_base *)
         std::__cxx11::list<int,_std::allocator<int>_>::begin
                   ((list<int,_std::allocator<int>_> *)&it);
    while( true ) {
      it2._M_node = (_List_node_base *)
                    std::__cxx11::list<int,_std::allocator<int>_>::end
                              ((list<int,_std::allocator<int>_> *)&it);
      bVar4 = std::operator==(&local_e8,(_Self *)&it2);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      local_f8._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::begin(&nfa->_finalStates);
      while( true ) {
        vec_tmp.
        super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::list<int,_std::allocator<int>_>::end(&nfa->_finalStates);
        bVar4 = std::operator==(&local_f8,
                                (_Self *)&vec_tmp.
                                          super__Vector_base<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        piVar7 = std::_List_iterator<int>::operator*(&local_e8);
        iVar2 = *piVar7;
        piVar8 = std::_List_const_iterator<int>::operator*(&local_f8);
        if (iVar2 == *piVar8) {
          pmVar5 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl.
                                    _M_node._M_size,(key_type *)&it);
          std::__cxx11::list<int,std::allocator<int>>::emplace_back<int&>
                    ((list<int,std::allocator<int>> *)&__return_storage_ptr__->_finalStates,pmVar5);
        }
        std::_List_const_iterator<int>::operator++(&local_f8);
      }
      std::_List_iterator<int>::operator++(&local_e8);
    }
    std::
    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ::vector((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
              *)&__range2);
    __end2 = std::forward_list<char,_std::allocator<char>_>::begin(&nfa->_inputs);
    c = (char *)std::forward_list<char,_std::allocator<char>_>::end(&nfa->_inputs);
    while (bVar4 = std::operator==(&__end2,(_Self *)&c), ((bVar4 ^ 0xffU) & 1) != 0) {
      next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
           (size_t)std::_Fwd_list_const_iterator<char>::operator*(&__end2);
      LevenshteinNFA::Move
                (&local_168,nfa,(list<int,_std::allocator<int>_> *)&it,
                 *(char *)next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      EpsilonClosure((list<int,_std::allocator<int>_> *)local_150,nfa,&local_168);
      std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_168);
      bVar4 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                        ((list<int,_std::allocator<int>_> *)local_150);
      if (bVar4) {
        local_16c = 0xb;
      }
      else {
        psVar1 = &dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_180._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::begin((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                      *)psVar1);
        local_188 = (_List_node_base *)
                    std::__cxx11::
                    list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    ::end((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                           *)psVar1);
        local_178._M_node =
             (_List_node_base *)
             std::
             find<std::_List_iterator<std::__cxx11::list<int,std::allocator<int>>>,std::__cxx11::list<int,std::allocator<int>>>
                       (local_180,
                        (_List_iterator<std::__cxx11::list<int,_std::allocator<int>_>_>)local_188,
                        (list<int,_std::allocator<int>_> *)local_150);
        local_190._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::end((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar4 = std::operator==(&local_178,&local_190);
        local_2d9 = false;
        if (bVar4) {
          psVar1 = &unmarkedStates.
                    super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    ._M_impl._M_node._M_size;
          local_1a0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
               ::begin((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                        *)psVar1);
          local_1a8 = (_List_node_base *)
                      std::__cxx11::
                      list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                      ::end((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                             *)psVar1);
          local_198._M_node =
               (_List_node_base *)
               std::
               find<std::_List_iterator<std::__cxx11::list<int,std::allocator<int>>>,std::__cxx11::list<int,std::allocator<int>>>
                         (local_1a0,
                          (_List_iterator<std::__cxx11::list<int,_std::allocator<int>_>_>)local_1a8,
                          (list<int,_std::allocator<int>_> *)local_150);
          local_1b0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
               ::end((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                      *)&unmarkedStates.
                         super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                         ._M_impl._M_node._M_size);
          local_2d9 = std::operator==(&local_198,&local_1b0);
        }
        if (local_2d9 != false) {
          std::__cxx11::
          list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
          ::emplace_back<std::__cxx11::list<int,std::allocator<int>>&>
                    ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                      *)&dfaStateNum._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (list<int,_std::allocator<int>_> *)local_150);
          local_1b4 = (int)markedStates.
                           super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                           ._M_impl._M_node._M_size;
          pVar13 = std::
                   map<std::__cxx11::list<int,std::allocator<int>>,int,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                   ::emplace<std::__cxx11::list<int,std::allocator<int>>&,int>
                             ((map<std::__cxx11::list<int,std::allocator<int>>,int,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                               *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl.
                                  _M_node._M_size,(list<int,_std::allocator<int>_> *)local_150,
                              &local_1b4);
          transition = (pair<int,_char>)pVar13.first._M_node;
          markedStates.
          super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          ._M_impl._M_node._M_size._0_4_ =
               (int)markedStates.
                    super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    ._M_impl._M_node._M_size + 1;
        }
        if ((*(char *)next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size ==
             '~') || (*(char *)next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                               _M_size == '|')) {
          pmVar5 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl.
                                    _M_node._M_size,(key_type *)&it);
          local_1e8._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::find(&__return_storage_ptr__->_defaultTrans,pmVar5);
          local_1f0._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::end(&__return_storage_ptr__->_defaultTrans);
          bVar4 = std::__detail::operator==(&local_1e8,&local_1f0);
          if (bVar4) {
            pmVar5 = std::
                     map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                   *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl
                                      ._M_node._M_size,(key_type *)&it);
            __args_1 = std::
                       map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                     *)&nfaInitial.super__List_base<int,_std::allocator<int>_>.
                                        _M_impl._M_node._M_size,(key_type *)local_150);
            pVar14 = std::
                     unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                     ::emplace<int&,int&>
                               ((unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                                 *)&__return_storage_ptr__->_defaultTrans,pmVar5,__args_1);
            _Stack_200._M_cur =
                 (__node_type *)
                 pVar14.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur;
            local_1f8 = pVar14.second;
            bVar3 = true;
            for (local_204 = 0; uVar10 = (ulong)local_204,
                sVar6 = std::
                        vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                        ::size((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                *)&__range2), uVar10 < sVar6; local_204 = local_204 + 1) {
              pvVar11 = std::
                        vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                        ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                      *)&__range2,(long)local_204);
              iVar2 = (pvVar11->first).first;
              pmVar5 = std::
                       map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                     *)&nfaInitial.super__List_base<int,_std::allocator<int>_>.
                                        _M_impl._M_node._M_size,(key_type *)&it);
              if (iVar2 == *pmVar5) {
                pvVar11 = std::
                          vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                        *)&__range2,(long)local_204);
                iVar2 = pvVar11->second;
                pmVar5 = std::
                         map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                         ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                       *)&nfaInitial.super__List_base<int,_std::allocator<int>_>.
                                          _M_impl._M_node._M_size,(key_type *)local_150);
                if (iVar2 != *pmVar5) goto LAB_00122460;
              }
              else {
LAB_00122460:
                pvVar11 = std::
                          vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                        *)&__range2,(long)local_204);
                pvVar12 = std::
                          vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                        *)&__range2,(long)local_204);
                std::pair<std::pair<int,_char>,_int>::pair<std::pair<int,_char>_&,_int_&,_true>
                          (&local_210,&pvVar11->first,&pvVar12->second);
                _Var15 = std::
                         map<std::pair<int,char>,int,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                         ::insert<std::pair<std::pair<int,char>,int>>
                                   ((map<std::pair<int,char>,int,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                                     *)&__return_storage_ptr__->_transTable,&local_210);
                map_tmp._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)_Var15.first._M_node;
              }
            }
          }
        }
        else {
          std::__cxx11::list<char,std::allocator<char>>::emplace_back<char_const&>
                    ((list<char,std::allocator<char>> *)&__return_storage_ptr__->_uniqueChars,
                     (char *)next.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                             _M_size);
          pmVar5 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl.
                                    _M_node._M_size,(key_type *)&it);
          pVar9 = std::make_pair<int&,char_const&>
                            (pmVar5,(char *)next.super__List_base<int,_std::allocator<int>_>._M_impl
                                            ._M_node._M_size);
          local_1d0.first = pVar9.first;
          local_1d0.second = pVar9.second;
          pmVar5 = std::
                   map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 *)&nfaInitial.super__List_base<int,_std::allocator<int>_>._M_impl.
                                    _M_node._M_size,(key_type *)local_150);
          std::pair<std::pair<int,_char>,_int>::pair<std::pair<int,_char>_&,_int_&,_true>
                    ((pair<std::pair<int,_char>,_int> *)
                     ((long)&it_1.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur
                     + 4),&local_1d0,pmVar5);
          std::
          vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
          ::push_back((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                       *)&__range2,
                      (value_type *)
                      ((long)&it_1.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                              _M_cur + 4));
        }
        local_16c = 0;
      }
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)local_150);
      std::_Fwd_list_const_iterator<char>::operator++(&__end2);
    }
    if (!bVar3) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&i_2)
      ;
      for (local_254 = 0; uVar10 = (ulong)local_254,
          sVar6 = std::
                  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                  ::size((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          *)&__range2), uVar10 < sVar6; local_254 = local_254 + 1) {
        pvVar11 = std::
                  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                  ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                *)&__range2,(long)local_254);
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&i_2,&pvVar11->second);
        *pmVar5 = *pmVar5 + 1;
      }
      for (local_258 = 0; uVar10 = (ulong)local_258,
          sVar6 = std::
                  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                  ::size((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                          *)&__range2), uVar10 < sVar6; local_258 = local_258 + 1) {
        pvVar11 = std::
                  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                  ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                *)&__range2,(long)local_258);
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&i_2,&pvVar11->second);
        if (*pmVar5 == 1) {
          pvVar11 = std::
                    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                    ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  *)&__range2,(long)local_258);
          pvVar12 = std::
                    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                    ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  *)&__range2,(long)local_258);
          std::pair<std::pair<int,_char>,_int>::pair<std::pair<int,_char>_&,_int_&,_true>
                    (&local_264,&pvVar11->first,&pvVar12->second);
          std::
          map<std::pair<int,char>,int,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
          ::insert<std::pair<std::pair<int,char>,int>>
                    ((map<std::pair<int,char>,int,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                      *)&__return_storage_ptr__->_transTable,&local_264);
        }
        else {
          pvVar11 = std::
                    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                    ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  *)&__range2,(long)local_258);
          pvVar12 = std::
                    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                    ::operator[]((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
                                  *)&__range2,(long)local_258);
          std::
          unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
          ::emplace<int&,int&>
                    ((unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
                      *)&__return_storage_ptr__->_defaultTrans,(int *)pvVar11,&pvVar12->second);
        }
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&i_2)
      ;
    }
    std::
    vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
    ::~vector((vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
               *)&__range2);
    std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)&it);
  } while( true );
}

Assistant:

LevenshteinDFA LevenshteinDFA::SubsetConstruct(const LevenshteinNFA &nfa)
    {
        LevenshteinDFA dfa{};
        int num = 0;

        std::list<std::list<int>> markedStates;
        std::list<std::list<int>> unmarkedStates;

        std::map<std::list<int>, int> dfaStateNum;

        std::list<int> nfaInitial;
        nfaInitial.emplace_back(nfa._initialState);

        std::list<int> first = EpsilonClosure(nfa, nfaInitial);
        unmarkedStates.emplace_back(first);

        //the initial dfa state
        int dfaInitial = num++;
        dfaStateNum[first] = dfaInitial;

        while (unmarkedStates.size() != 0)
        {
            bool tag=false;
            std::list<int> aState = unmarkedStates.front();
            unmarkedStates.pop_front();

            markedStates.emplace_back(aState);

            //Kinda killer, should redo
            for (std::list<int>::iterator it = aState.begin(); it != aState.end();++it)
            {
                for (auto it2 = nfa._finalStates.begin(); it2 != nfa._finalStates.end();++it2)
                {
                    if (*it == *it2)
                    {
                        dfa._finalStates.emplace_back(dfaStateNum[aState]);
                    }
                }
            }
            std::vector<std::pair<std::pair<int,char>,int>> vec_tmp;
//            for each (char c in nfa->inputs)
            for  (const char &c : nfa._inputs)
            {
                std::list<int> next = EpsilonClosure(nfa, nfa.Move(aState, c));
                if (next.empty()) continue;
                if (std::find(unmarkedStates.begin(), unmarkedStates.end(), next) == unmarkedStates.end() &&
                    std::find(markedStates.begin(), markedStates.end(), next) == markedStates.end())
                {
                    unmarkedStates.emplace_back(next);
                    dfaStateNum.emplace(next, num++);
                }
                if (c != (char)LevenshteinNFA::Constants::Insertion && c != (char)LevenshteinNFA::Constants::Deletion)
                {
                    dfa._uniqueChars.emplace_back(c);
                    std::pair<int, char> transition = std::make_pair(dfaStateNum[aState],c);
                    vec_tmp.push_back(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                   // dfa->transTable->insert(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                }
                else
                {
                    auto it = dfa._defaultTrans.find(dfaStateNum[aState]);
                    //TODO 数字 ascli值太大
                    if (it == dfa._defaultTrans.end())
                    {
                        dfa._defaultTrans.emplace(dfaStateNum[aState], dfaStateNum[next]);
                        tag = true;
                        for(int i=0;i<vec_tmp.size();i++){
                            if(!(vec_tmp[i].first.first == dfaStateNum[aState]&& vec_tmp[i].second == dfaStateNum[next])){
                                dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                            }

                        }
                    }
                }
            }
            if(!tag){
                std::map<int,int> map_tmp;
                for(int i=0;i<vec_tmp.size();i++){
                        map_tmp[vec_tmp[i].second]++;
                }
                for(int i=0;i<vec_tmp.size();i++){
                    //printf("%d %d %d\n",vec_tmp[i].second,map_tmp[vec_tmp[i].second],vec_tmp.size());
                    if(map_tmp[vec_tmp[i].second]==1){
                        dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                    }
                    else{
                        dfa._defaultTrans.emplace(vec_tmp[i].first.first,vec_tmp[i].second);
                    }
                }
            }
        }
        dfa._finalStates.sort();
        dfa._finalStates.unique();
        dfa._uniqueChars.sort();
        dfa._uniqueChars.unique();
        return dfa;
    }